

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::tent_dist<float>::cdf(tent_dist<float> *this,result_type_conflict1 x)

{
  char *in_RCX;
  int in_EDX;
  void *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float fVar1;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  result_type_conflict1 rVar4;
  result_type_conflict1 rVar5;
  undefined4 local_4;
  
  param_type::m(in_RDI,in_RSI,in_EDX,in_RCX,in_R8D,in_R9D);
  fVar1 = in_XMM0_Da - extraout_XMM0_Da;
  rVar2 = param_type::d(in_RDI);
  if (-rVar2 < fVar1) {
    if (0.0 < fVar1) {
      rVar2 = param_type::d(in_RDI);
      if (rVar2 <= fVar1) {
        local_4 = 1.0;
      }
      else {
        rVar2 = param_type::d(in_RDI);
        rVar3 = param_type::d(in_RDI);
        rVar4 = param_type::d(in_RDI);
        rVar5 = param_type::d(in_RDI);
        local_4 = 1.0 - ((fVar1 - rVar2) * (fVar1 - rVar3)) / (rVar4 * 2.0 * rVar5);
      }
    }
    else {
      rVar2 = param_type::d(in_RDI);
      rVar3 = param_type::d(in_RDI);
      rVar4 = param_type::d(in_RDI);
      rVar5 = param_type::d(in_RDI);
      local_4 = ((fVar1 + rVar2) * (fVar1 + rVar3)) / (rVar4 * 2.0 * rVar5);
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

cdf(result_type x) const {
      x -= P.m();
      if (x <= -P.d())
        return 0;
      if (x <= 0)
        return (x + P.d()) * (x + P.d()) / (result_type(2) * P.d() * P.d());
      if (x < P.d())
        return 1 - (x - P.d()) * (x - P.d()) / (result_type(2) * P.d() * P.d());
      return 1;
    }